

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls.cpp
# Opt level: O2

golomb_code_table *
charls::anon_unknown_79::initialize_table(golomb_code_table *__return_storage_ptr__,int32_t k)

{
  int32_t iVar1;
  pair<int,_int> pVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = 0;
  memset(__return_storage_ptr__,0,0x800);
  while( true ) {
    uVar3 = (uint)(short)iVar4;
    iVar1 = map_error_value(uVar3);
    pVar2 = create_encoded_value(k,iVar1);
    if (8 < (uint)pVar2.first) break;
    golomb_code_table::add_entry
              (__return_storage_ptr__,(uint8_t)pVar2.second,
               (golomb_code)((ulong)uVar3 | (long)pVar2 << 0x20));
    iVar4 = uVar3 + 1;
  }
  iVar4 = 0xffff;
  while( true ) {
    uVar3 = (uint)(short)iVar4;
    iVar1 = map_error_value(uVar3);
    pVar2 = create_encoded_value(k,iVar1);
    if (8 < (uint)pVar2.first) break;
    golomb_code_table::add_entry
              (__return_storage_ptr__,(uint8_t)pVar2.second,
               (golomb_code)((ulong)uVar3 | (long)pVar2 << 0x20));
    iVar4 = uVar3 - 1;
  }
  return __return_storage_ptr__;
}

Assistant:

golomb_code_table initialize_table(const int32_t k) noexcept
{
    golomb_code_table table;
    for (int16_t error_value{};; ++error_value)
    {
        // Q is not used when k != 0
        const int32_t mapped_error_value{map_error_value(error_value)};
        const std::pair<int32_t, int32_t> pair_code{create_encoded_value(k, mapped_error_value)};
        if (static_cast<size_t>(pair_code.first) > golomb_code_table::byte_bit_count)
            break;

        const golomb_code code(error_value, conditional_static_cast<int16_t>(pair_code.first));
        table.add_entry(static_cast<uint8_t>(pair_code.second), code);
    }

    for (int16_t error_value{-1};; --error_value)
    {
        // Q is not used when k != 0
        const int32_t mapped_error_value{map_error_value(error_value)};
        const std::pair<int32_t, int32_t> pair_code{create_encoded_value(k, mapped_error_value)};
        if (static_cast<size_t>(pair_code.first) > golomb_code_table::byte_bit_count)
            break;

        const auto code{golomb_code(error_value, static_cast<int16_t>(pair_code.first))};
        table.add_entry(static_cast<uint8_t>(pair_code.second), code);
    }

    return table;
}